

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void cbtCollisionWorld::objectQuerySingleInternal
               (cbtConvexShape *castShape,cbtTransform *convexFromTrans,cbtTransform *convexToTrans,
               cbtCollisionObjectWrapper *colObjWrap,ConvexResultCallback *resultCallback,
               cbtScalar allowedPenetration)

{
  undefined8 *puVar1;
  cbtScalar *pcVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtStaticPlaneShape *plane;
  cbtTransform *this;
  cbtDbvt *this_00;
  long lVar10;
  float fVar11;
  undefined4 uVar12;
  undefined1 auVar13 [12];
  cbtVector3 cVar14;
  cbtConvexShape *pcVar15;
  cbtVector3 cVar16;
  char cVar17;
  int iVar18;
  cbtBvhTriangleMeshShape *triangleMesh;
  long lVar19;
  cbtConvexCast *this_01;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  cbtScalar cVar33;
  float fVar34;
  cbtVector3 boxMinLocal;
  cbtVector3 boxMaxLocal;
  cbtGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;
  cbtContinuousConvexCollision convexCaster1;
  LocalConvexResult localConvexResult;
  CastResult castResult;
  cbtVoronoiSimplexSolver simplexSolver;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  cbtConvexShape *local_350;
  cbtVector3 local_348;
  cbtCollisionObject *local_338;
  float local_330;
  float local_32c;
  float local_328;
  cbtScalar local_324;
  cbtScalar local_320;
  cbtScalar local_31c;
  cbtScalar local_318;
  cbtScalar local_314;
  cbtScalar local_310;
  float local_30c;
  float local_308;
  cbtScalar local_304;
  float local_300;
  cbtScalar local_2fc;
  cbtScalar local_2f8;
  cbtScalar local_2f4;
  cbtScalar local_2f0;
  cbtScalar local_2ec;
  undefined1 local_2e8 [8];
  undefined8 uStack_2e0;
  cbtTransform *local_2b8;
  ConvexResultCallback *local_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined8 local_298;
  cbtConvexShape *pcStack_290;
  undefined8 local_288;
  cbtStaticPlaneShape *pcStack_280;
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 local_26c;
  undefined1 local_268 [8];
  cbtVoronoiSimplexSolver *pcStack_260;
  undefined8 local_258;
  cbtVoronoiSimplexSolver *pcStack_250;
  cbtScalar local_248;
  float fStack_244;
  cbtScalar acStack_240 [2];
  float local_238;
  float fStack_234;
  float afStack_230 [20];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  undefined4 uStack_1d4;
  cbtConvexShape *local_1d0;
  cbtStaticPlaneShape *pcStack_1c8;
  cbtScalar local_1c0;
  undefined8 local_1b8;
  cbtScalar local_1b0;
  undefined8 local_1ac;
  undefined1 local_198 [16];
  undefined8 local_188;
  cbtTransform *local_180;
  undefined8 local_178;
  cbtScalar local_170;
  cbtScalar local_16c;
  undefined1 local_168 [16];
  ConvexResultCallback *local_158;
  float local_110;
  float fStack_10c;
  float fStack_108;
  cbtScalar cStack_104;
  cbtScalar local_100 [2];
  cbtScalar acStack_f8 [2];
  cbtScalar local_f0;
  cbtScalar local_e8 [3];
  cbtScalar local_dc [5];
  cbtScalar local_c8;
  cbtScalar local_c0;
  ConvexResultCallback *local_b8;
  cbtCollisionObject *local_b0;
  cbtStaticPlaneShape *local_a8;
  cbtScalar local_64;
  byte local_4c;
  
  plane = (cbtStaticPlaneShape *)colObjWrap->m_shape;
  this = colObjWrap->m_worldTransform;
  iVar18 = (plane->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType;
  if (iVar18 < 0x18) {
    local_268 = (undefined1  [8])&PTR_DebugDraw_00b6ffb0;
    local_1b8 = 0;
    local_1ac = 0x38d1b71700000020;
    local_1c0 = resultCallback->m_closestHitFraction;
    local_64 = 0.0001;
    local_4c = local_4c & 0xf0;
    local_348.m_floats._0_8_ = &PTR__cbtConvexPenetrationDepthSolver_00b73cc0;
    local_1b0 = allowedPenetration;
    cbtContinuousConvexCollision::cbtContinuousConvexCollision
              ((cbtContinuousConvexCollision *)local_2e8,castShape,(cbtConvexShape *)plane,
               (cbtVoronoiSimplexSolver *)local_198,(cbtConvexPenetrationDepthSolver *)&local_348);
    iVar18 = (**(_func_int **)((long)local_2e8 + 0x10))
                       (local_2e8,convexFromTrans,convexToTrans,this,this,local_268);
    if ((char)iVar18 != '\0') {
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fStack_1dc * fStack_1dc)),ZEXT416((uint)local_1e0),
                                ZEXT416((uint)local_1e0));
      auVar30 = vfmadd213ss_fma(ZEXT416((uint)fStack_1d8),ZEXT416((uint)fStack_1d8),auVar30);
      fVar34 = auVar30._0_4_;
      if ((0.0001 < fVar34) && (local_1c0 < resultCallback->m_closestHitFraction)) {
        if (fVar34 < 0.0) {
          fVar34 = sqrtf(fVar34);
        }
        else {
          auVar30 = vsqrtss_avx(auVar30,auVar30);
          fVar34 = auVar30._0_4_;
        }
        fVar34 = 1.0 / fVar34;
        local_1e0 = fVar34 * local_1e0;
        fStack_1dc = fVar34 * fStack_1dc;
        fStack_1d8 = fVar34 * fStack_1d8;
        local_2a8 = (undefined1  [8])colObjWrap->m_collisionObject;
        uStack_2a0 = (cbtVoronoiSimplexSolver *)0x0;
        local_298 = (cbtConvexPenetrationDepthSolver *)CONCAT44(fStack_1dc,local_1e0);
        pcStack_290 = (cbtConvexShape *)CONCAT44(uStack_1d4,fStack_1d8);
        local_288 = local_1d0;
        pcStack_280 = pcStack_1c8;
        local_278 = local_1c0;
        (*resultCallback->_vptr_ConvexResultCallback[3])(resultCallback,local_2a8,1);
      }
    }
    this_01 = (cbtConvexCast *)local_2e8;
  }
  else {
    local_350 = castShape;
    if (10 < iVar18 - 0x19U) {
      if (iVar18 != 0x25) {
        return;
      }
      CProfileSample::CProfileSample((CProfileSample *)local_360,"convexSweepCompound");
      cbtTransform::inverse(this);
      fVar34 = (convexFromTrans->m_basis).m_el[1].m_floats[0];
      cVar33 = (convexFromTrans->m_basis).m_el[0].m_floats[0];
      cVar3 = (convexFromTrans->m_basis).m_el[0].m_floats[1];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_268._4_4_)),
                                ZEXT416((uint)cVar33),ZEXT416((uint)local_268._0_4_));
      cVar4 = (convexFromTrans->m_basis).m_el[2].m_floats[0];
      auVar21 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar4),ZEXT416((uint)pcStack_260._0_4_));
      fVar5 = (convexFromTrans->m_basis).m_el[1].m_floats[1];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_268._4_4_)),ZEXT416((uint)cVar3)
                                ,ZEXT416((uint)local_268._0_4_));
      cVar6 = (convexFromTrans->m_basis).m_el[2].m_floats[1];
      auVar22 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar6),ZEXT416((uint)pcStack_260._0_4_));
      cVar7 = (convexFromTrans->m_basis).m_el[0].m_floats[2];
      fVar11 = (convexFromTrans->m_basis).m_el[1].m_floats[2];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (float)local_268._4_4_)),
                                ZEXT416((uint)cVar7),ZEXT416((uint)local_268._0_4_));
      cVar8 = (convexFromTrans->m_basis).m_el[2].m_floats[2];
      auVar24 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar8),ZEXT416((uint)pcStack_260._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar34),ZEXT416((uint)local_258._4_4_));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar33),
                                    ZEXT416((uint)(cbtScalar)local_258));
      auVar26 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar4),ZEXT416((uint)pcStack_250._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)local_258._4_4_));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar3),ZEXT416((uint)(cbtScalar)local_258)
                                   );
      auVar32 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar6),ZEXT416((uint)pcStack_250._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)local_258._4_4_));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar7),ZEXT416((uint)(cbtScalar)local_258)
                                   );
      auVar28 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar8),ZEXT416((uint)pcStack_250._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar34),ZEXT416((uint)fStack_244));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)local_248),ZEXT416((uint)cVar33));
      auVar31 = vfmadd231ss_fma(auVar30,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar4));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fStack_244));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)local_248),ZEXT416((uint)cVar3));
      auVar27 = vfmadd231ss_fma(auVar30,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar6));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)fStack_244));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)local_248),ZEXT416((uint)cVar7));
      auVar23 = vfmadd231ss_fma(auVar30,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar8));
      cVar33 = (convexFromTrans->m_origin).m_floats[0];
      fVar34 = (convexFromTrans->m_origin).m_floats[1];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_268._4_4_)),
                                ZEXT416((uint)cVar33),ZEXT416((uint)local_268._0_4_));
      cVar3 = (convexFromTrans->m_origin).m_floats[2];
      auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_260._0_4_));
      auVar25 = vmulss_avx512f(ZEXT416((uint)local_258._4_4_),ZEXT416((uint)fVar34));
      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar33),ZEXT416((uint)(cbtScalar)local_258));
      auVar29 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_250._0_4_));
      auVar25 = vmulss_avx512f(ZEXT416((uint)fStack_244),ZEXT416((uint)fVar34));
      auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar33),ZEXT416((uint)local_248));
      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar3),ZEXT416((uint)acStack_240[0]));
      auVar30 = vinsertps_avx(ZEXT416((uint)(auVar30._0_4_ + local_238)),
                              ZEXT416((uint)(auVar29._0_4_ + fStack_234)),0x10);
      local_168 = vinsertps_avx(auVar30,ZEXT416((uint)(auVar25._0_4_ + afStack_230[0])),0x28);
      local_198._4_4_ = auVar22._0_4_;
      local_198._0_4_ = auVar21._0_4_;
      local_198._12_4_ = 0;
      local_198._8_4_ = auVar24._0_4_;
      local_188._0_4_ = auVar26._0_4_;
      local_188._4_4_ = auVar32._0_4_;
      local_180 = (cbtTransform *)(ulong)auVar28._0_4_;
      local_178 = (cbtTransform *)CONCAT44(auVar27._0_4_,auVar31._0_4_);
      local_170 = auVar23._0_4_;
      local_16c = 0.0;
      (*(local_350->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                (local_350,local_198,local_2a8,local_2e8);
      cbtTransform::inverse(this);
      fVar34 = (convexToTrans->m_basis).m_el[1].m_floats[0];
      cVar33 = (convexToTrans->m_basis).m_el[0].m_floats[0];
      cVar3 = (convexToTrans->m_basis).m_el[0].m_floats[1];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_268._4_4_)),
                                ZEXT416((uint)cVar33),ZEXT416((uint)local_268._0_4_));
      cVar4 = (convexToTrans->m_basis).m_el[2].m_floats[0];
      auVar21 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar4),ZEXT416((uint)pcStack_260._0_4_));
      fVar5 = (convexToTrans->m_basis).m_el[1].m_floats[1];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_268._4_4_)),ZEXT416((uint)cVar3)
                                ,ZEXT416((uint)local_268._0_4_));
      cVar6 = (convexToTrans->m_basis).m_el[2].m_floats[1];
      auVar22 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar6),ZEXT416((uint)pcStack_260._0_4_));
      cVar7 = (convexToTrans->m_basis).m_el[0].m_floats[2];
      fVar11 = (convexToTrans->m_basis).m_el[1].m_floats[2];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (float)local_268._4_4_)),
                                ZEXT416((uint)cVar7),ZEXT416((uint)local_268._0_4_));
      cVar8 = (convexToTrans->m_basis).m_el[2].m_floats[2];
      auVar24 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar8),ZEXT416((uint)pcStack_260._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar34),ZEXT416((uint)local_258._4_4_));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar33),
                                    ZEXT416((uint)(cbtScalar)local_258));
      auVar26 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar4),ZEXT416((uint)pcStack_250._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)local_258._4_4_));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar3),ZEXT416((uint)(cbtScalar)local_258)
                                   );
      auVar32 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar6),ZEXT416((uint)pcStack_250._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)local_258._4_4_));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar7),ZEXT416((uint)(cbtScalar)local_258)
                                   );
      auVar28 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar8),ZEXT416((uint)pcStack_250._0_4_));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar34),ZEXT416((uint)fStack_244));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)local_248),ZEXT416((uint)cVar33));
      auVar31 = vfmadd231ss_fma(auVar30,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar4));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fStack_244));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)local_248),ZEXT416((uint)cVar3));
      auVar27 = vfmadd231ss_fma(auVar30,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar6));
      auVar30 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)fStack_244));
      auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)local_248),ZEXT416((uint)cVar7));
      auVar23 = vfmadd231ss_fma(auVar30,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar8));
      cVar33 = (convexToTrans->m_origin).m_floats[0];
      fVar34 = (convexToTrans->m_origin).m_floats[1];
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_268._4_4_)),
                                ZEXT416((uint)cVar33),ZEXT416((uint)local_268._0_4_));
      cVar3 = (convexToTrans->m_origin).m_floats[2];
      auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_260._0_4_));
      auVar25 = vmulss_avx512f(ZEXT416((uint)local_258._4_4_),ZEXT416((uint)fVar34));
      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar33),ZEXT416((uint)(cbtScalar)local_258));
      auVar29 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_250._0_4_));
      auVar25 = vmulss_avx512f(ZEXT416((uint)fStack_244),ZEXT416((uint)fVar34));
      auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar33),ZEXT416((uint)local_248));
      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar3),ZEXT416((uint)acStack_240[0]));
      auVar30 = vinsertps_avx(ZEXT416((uint)(auVar30._0_4_ + local_238)),
                              ZEXT416((uint)(auVar29._0_4_ + fStack_234)),0x10);
      local_168 = vinsertps_avx(auVar30,ZEXT416((uint)(auVar25._0_4_ + afStack_230[0])),0x28);
      local_198._4_4_ = auVar22._0_4_;
      local_198._0_4_ = auVar21._0_4_;
      local_198._12_4_ = 0;
      local_198._8_4_ = auVar24._0_4_;
      local_188 = (cbtConvexShape *)CONCAT44(auVar32._0_4_,auVar26._0_4_);
      local_180 = (cbtTransform *)(ulong)auVar28._0_4_;
      local_178 = (cbtTransform *)CONCAT44(auVar27._0_4_,auVar31._0_4_);
      local_170 = auVar23._0_4_;
      local_16c = 0.0;
      (*(local_350->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                (local_350,local_198,&local_348,local_370);
      if (local_348.m_floats[0] < (float)local_2a8._0_4_) {
        local_2a8._0_4_ = local_348.m_floats[0];
      }
      if (local_348.m_floats[1] < (float)local_2a8._4_4_) {
        local_2a8._4_4_ = local_348.m_floats[1];
      }
      if (local_348.m_floats[2] < (float)uStack_2a0) {
        uStack_2a0 = (cbtVoronoiSimplexSolver *)CONCAT44(uStack_2a0._4_4_,local_348.m_floats[2]);
      }
      if (local_348.m_floats[3] < uStack_2a0._4_4_) {
        uStack_2a0 = (cbtVoronoiSimplexSolver *)CONCAT44(local_348.m_floats[3],(float)uStack_2a0);
      }
      if ((float)local_2e8._0_4_ < (float)local_370._0_4_) {
        local_2e8._0_4_ = local_370._0_4_;
      }
      if ((float)local_2e8._4_4_ < (float)local_370._4_4_) {
        local_2e8._4_4_ = local_370._4_4_;
      }
      if ((float)uStack_2e0 < fStack_368) {
        uStack_2e0._0_4_ = fStack_368;
      }
      if (uStack_2e0._4_4_ < fStack_364) {
        uStack_2e0._4_4_ = fStack_364;
      }
      local_198._0_8_ = &PTR__ICollide_00b6ff08;
      local_188 = local_350;
      local_168._8_8_ = this;
      local_168._0_8_ = plane;
      this_00 = *(cbtDbvt **)((plane->m_localScaling).m_floats + 3);
      local_198._8_8_ = colObjWrap;
      local_180 = convexFromTrans;
      local_178 = convexToTrans;
      local_170 = allowedPenetration;
      local_158 = resultCallback;
      if (this_00 == (cbtDbvt *)0x0) {
        if (0 < (int)(plane->m_localAabbMin).m_floats[1]) {
          lVar19 = 0x40;
          lVar20 = 0;
          do {
            lVar10 = *(long *)(plane->m_localAabbMax).m_floats;
            puVar1 = (undefined8 *)(lVar10 + -0x40 + lVar19);
            local_268 = (undefined1  [8])*puVar1;
            pcStack_260 = (cbtVoronoiSimplexSolver *)puVar1[1];
            puVar1 = (undefined8 *)(lVar10 + -0x30 + lVar19);
            local_258 = (_func_int **)*puVar1;
            pcStack_250 = (cbtVoronoiSimplexSolver *)puVar1[1];
            pcVar2 = (cbtScalar *)(lVar10 + -0x20 + lVar19);
            _local_248 = *(undefined8 *)pcVar2;
            acStack_240 = *(cbtScalar (*) [2])(pcVar2 + 2);
            pcVar2 = (cbtScalar *)(lVar10 + -0x10 + lVar19);
            _local_238 = *(undefined8 *)pcVar2;
            afStack_230._0_8_ = *(undefined8 *)(pcVar2 + 2);
            objectQuerySingleInternal::cbtCompoundLeafCallback::ProcessChild
                      ((cbtCompoundLeafCallback *)local_198,(int)lVar20,(cbtTransform *)local_268,
                       *(cbtCollisionShape **)(lVar10 + lVar19));
            lVar20 = lVar20 + 1;
            lVar19 = lVar19 + 0x58;
          } while (lVar20 < (int)(plane->m_localAabbMin).m_floats[1]);
        }
      }
      else {
        local_268 = local_2a8;
        pcStack_260 = uStack_2a0;
        local_258 = (_func_int **)local_2e8;
        pcStack_250 = uStack_2e0;
        cbtDbvt::collideTV(this_00,this_00->m_root,(cbtDbvtVolume *)local_268,(ICollide *)local_198)
        ;
      }
      CProfileSample::~CProfileSample((CProfileSample *)local_360);
      return;
    }
    if (iVar18 != 0x22) {
      local_2b8 = this;
      local_2b0 = resultCallback;
      local_c0 = allowedPenetration;
      local_a8 = plane;
      if (iVar18 == 0x19) {
        cbtTransform::inverse(this);
        cVar33 = (convexFromTrans->m_origin).m_floats[0];
        fVar34 = (convexFromTrans->m_origin).m_floats[1];
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_268._4_4_)),
                                  ZEXT416((uint)cVar33),ZEXT416((uint)local_268._0_4_));
        cVar3 = (convexFromTrans->m_origin).m_floats[2];
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_260._0_4_));
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * local_258._4_4_)),ZEXT416((uint)cVar33),
                                  ZEXT416((uint)(cbtScalar)local_258));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_250._0_4_));
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fStack_244)),ZEXT416((uint)local_248),
                                  ZEXT416((uint)cVar33));
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar3));
        auVar30 = vinsertps_avx(ZEXT416((uint)(auVar30._0_4_ + local_238)),
                                ZEXT416((uint)(auVar21._0_4_ + fStack_234)),0x10);
        _local_2e8 = (cbtScalar  [4])
                     vinsertps_avx(auVar30,ZEXT416((uint)(auVar22._0_4_ + afStack_230[0])),0x28);
        cVar33 = (convexToTrans->m_origin).m_floats[0];
        fVar34 = (convexToTrans->m_origin).m_floats[1];
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_268._4_4_)),
                                  ZEXT416((uint)cVar33),ZEXT416((uint)local_268._0_4_));
        cVar3 = (convexToTrans->m_origin).m_floats[2];
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_260._0_4_));
        auVar27 = ZEXT416((uint)local_258._4_4_);
        auVar21 = vmulss_avx512f(auVar27,ZEXT416((uint)fVar34));
        auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)cVar33),
                                      ZEXT416((uint)(cbtScalar)local_258));
        auVar22 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)cVar3),ZEXT416((uint)pcStack_250._0_4_))
        ;
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fStack_244)),ZEXT416((uint)local_248),
                                  ZEXT416((uint)cVar33));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar3));
        auVar22 = vaddss_avx512f(ZEXT416((uint)fStack_234),auVar22);
        auVar30 = vinsertps_avx(ZEXT416((uint)(local_238 + auVar30._0_4_)),auVar22,0x10);
        local_348.m_floats =
             (cbtScalar  [4])
             vinsertps_avx(auVar30,ZEXT416((uint)(afStack_230[0] + auVar21._0_4_)),0x28);
        fVar34 = (convexToTrans->m_basis).m_el[1].m_floats[0];
        cVar33 = (convexToTrans->m_basis).m_el[0].m_floats[0];
        cVar3 = (convexToTrans->m_basis).m_el[0].m_floats[1];
        auVar22 = ZEXT416((uint)local_268._0_4_);
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_268._4_4_)),
                                  ZEXT416((uint)cVar33),auVar22);
        cVar4 = (convexToTrans->m_basis).m_el[2].m_floats[0];
        auVar24 = ZEXT416((uint)pcStack_260._0_4_);
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar4),auVar24);
        fVar5 = (convexToTrans->m_basis).m_el[1].m_floats[1];
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_268._4_4_)),
                                  ZEXT416((uint)cVar3),auVar22);
        cVar6 = (convexToTrans->m_basis).m_el[2].m_floats[1];
        auVar23 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)cVar6),auVar24);
        cVar7 = (convexToTrans->m_basis).m_el[0].m_floats[2];
        cVar8 = (convexToTrans->m_basis).m_el[1].m_floats[2];
        auVar21 = vmulss_avx512f(ZEXT416((uint)local_268._4_4_),ZEXT416((uint)cVar8));
        auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)cVar7),auVar22);
        cVar9 = (convexToTrans->m_basis).m_el[2].m_floats[2];
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar9),auVar24);
        auVar31 = ZEXT416((uint)(cbtScalar)local_258);
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * local_258._4_4_)),ZEXT416((uint)cVar33),
                                  auVar31);
        auVar26 = ZEXT416((uint)pcStack_250._0_4_);
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar4),auVar26);
        auVar24 = vmulss_avx512f(auVar27,ZEXT416((uint)fVar5));
        auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)cVar3),auVar31);
        auVar25 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)cVar6),auVar26);
        auVar24 = vmulss_avx512f(auVar27,ZEXT416((uint)cVar8));
        auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)cVar7),auVar31);
        auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar9),auVar26);
        auVar32 = ZEXT416((uint)local_248);
        auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fStack_244)),auVar32,ZEXT416((uint)cVar33)
                                 );
        auVar28 = ZEXT416((uint)acStack_240[0]);
        auVar31 = vfmadd231ss_fma(auVar31,auVar28,ZEXT416((uint)cVar4));
        auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fStack_244)),auVar32,ZEXT416((uint)cVar3));
        auVar26 = vfmadd231ss_avx512f(auVar27,auVar28,ZEXT416((uint)cVar6));
        auVar27 = vmulss_avx512f(ZEXT416((uint)fStack_244),ZEXT416((uint)cVar8));
        auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar7),auVar32);
        auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar9),auVar28);
        local_2a8._4_4_ = auVar23._0_4_;
        local_2a8._0_4_ = auVar30._0_4_;
        uStack_2a0 = (cbtVoronoiSimplexSolver *)(ulong)auVar21._0_4_;
        local_298 = (cbtConvexPenetrationDepthSolver *)CONCAT44(auVar25._0_4_,auVar22._0_4_);
        pcStack_290 = (cbtConvexShape *)(ulong)auVar24._0_4_;
        local_288 = (cbtConvexShape *)CONCAT44(auVar26._0_4_,auVar31._0_4_);
        cVar33 = 0.0;
        pcStack_280 = (cbtStaticPlaneShape *)(ulong)auVar27._0_4_;
        local_278 = 0.0;
        uStack_274 = 0;
        uStack_270 = 0;
        local_26c = 0;
        local_338 = colObjWrap->m_collisionObject;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])
                  (plane);
        pcVar15 = local_350;
        cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback
                  ((cbtTriangleConvexcastCallback *)local_198,local_350,convexFromTrans,
                   convexToTrans,local_2b8,cVar33);
        local_198._0_8_ = &PTR__cbtTriangleCallback_00b6fe78;
        local_b8 = local_2b0;
        local_b0 = local_338;
        local_c8 = local_2b0->m_closestHitFraction;
        (*(pcVar15->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                  (pcVar15,local_2a8,local_370,local_360);
        cbtBvhTriangleMeshShape::performConvexcast
                  ((cbtBvhTriangleMeshShape *)plane,(cbtTriangleCallback *)local_198,
                   (cbtVector3 *)local_2e8,&local_348,(cbtVector3 *)local_370,
                   (cbtVector3 *)local_360);
      }
      else {
        cbtTransform::inverse(this);
        local_318 = (convexFromTrans->m_origin).m_floats[0];
        local_320 = (convexFromTrans->m_origin).m_floats[1];
        local_31c = (convexFromTrans->m_origin).m_floats[2];
        local_310 = (convexToTrans->m_origin).m_floats[0];
        local_314 = (convexToTrans->m_origin).m_floats[1];
        fVar34 = (convexToTrans->m_basis).m_el[1].m_floats[0];
        auVar30 = vmulss_avx512f(ZEXT416((uint)local_268._4_4_),ZEXT416((uint)fVar34));
        cVar33 = (convexToTrans->m_basis).m_el[0].m_floats[0];
        cVar3 = (convexToTrans->m_basis).m_el[0].m_floats[1];
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar33),ZEXT416((uint)local_268._0_4_));
        cVar4 = (convexToTrans->m_basis).m_el[2].m_floats[0];
        auVar25 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar4),ZEXT416((uint)pcStack_260._0_4_))
        ;
        fVar5 = (convexToTrans->m_basis).m_el[1].m_floats[1];
        auVar30 = vmulss_avx512f(ZEXT416((uint)local_268._4_4_),ZEXT416((uint)fVar5));
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar3),ZEXT416((uint)local_268._0_4_));
        cVar6 = (convexToTrans->m_basis).m_el[2].m_floats[1];
        auVar26 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar6),ZEXT416((uint)pcStack_260._0_4_))
        ;
        cVar7 = (convexToTrans->m_basis).m_el[0].m_floats[2];
        auVar30 = vmulss_avx512f(ZEXT416((uint)local_258._4_4_),ZEXT416((uint)fVar34));
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar33),ZEXT416((uint)(cbtScalar)local_258))
        ;
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fStack_244 * fVar34)),ZEXT416((uint)local_248),
                                  ZEXT416((uint)cVar33));
        fVar34 = (convexToTrans->m_basis).m_el[1].m_floats[2];
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar4),ZEXT416((uint)pcStack_250._0_4_));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar4));
        auVar22 = vmulss_avx512f(ZEXT416((uint)local_258._4_4_),ZEXT416((uint)fVar5));
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar3),ZEXT416((uint)(cbtScalar)local_258));
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fStack_244 * fVar5)),ZEXT416((uint)local_248),
                                  ZEXT416((uint)cVar3));
        local_30c = (float)local_268._4_4_;
        auVar31 = vmulss_avx512f(ZEXT416((uint)local_268._4_4_),ZEXT416((uint)fVar34));
        local_2fc = (cbtScalar)local_268._0_4_;
        auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)cVar7),ZEXT416((uint)local_268._0_4_));
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar6),ZEXT416((uint)pcStack_250._0_4_));
        auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar6));
        local_308 = local_258._4_4_;
        auVar27 = vmulss_avx512f(ZEXT416((uint)local_258._4_4_),ZEXT416((uint)fVar34));
        local_2f4 = (cbtScalar)local_258;
        auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar7),ZEXT416((uint)(cbtScalar)local_258));
        local_300 = fStack_244;
        local_2ec = local_248;
        auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fStack_244 * fVar34)),ZEXT416((uint)local_248),
                                  ZEXT416((uint)cVar7));
        cVar33 = (convexToTrans->m_basis).m_el[2].m_floats[2];
        local_304 = pcStack_260._0_4_;
        auVar32 = vfmadd231ss_avx512f(auVar31,ZEXT416((uint)cVar33),ZEXT416((uint)pcStack_260._0_4_)
                                     );
        local_2f8 = pcStack_250._0_4_;
        auVar31 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar33),ZEXT416((uint)pcStack_250._0_4_));
        local_2f0 = acStack_240[0];
        auVar27 = vfmadd231ss_fma(auVar23,ZEXT416((uint)acStack_240[0]),ZEXT416((uint)cVar33));
        local_324 = (convexToTrans->m_origin).m_floats[2];
        local_2a8._4_4_ = auVar26._0_4_;
        local_2a8._0_4_ = auVar25._0_4_;
        uStack_2a0 = (cbtVoronoiSimplexSolver *)(ulong)auVar32._0_4_;
        local_298 = (cbtConvexPenetrationDepthSolver *)CONCAT44(auVar22._0_4_,auVar30._0_4_);
        local_328 = local_238;
        pcStack_290 = (cbtConvexShape *)(ulong)auVar31._0_4_;
        local_330 = fStack_234;
        local_288 = (cbtConvexShape *)CONCAT44(auVar24._0_4_,auVar21._0_4_);
        local_32c = afStack_230[0];
        cVar33 = 0.0;
        pcStack_280 = (cbtStaticPlaneShape *)(ulong)auVar27._0_4_;
        local_278 = 0.0;
        uStack_274 = 0;
        uStack_270 = 0;
        local_26c = 0;
        local_338 = colObjWrap->m_collisionObject;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])
                  (plane);
        pcVar15 = local_350;
        cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback
                  ((cbtTriangleConvexcastCallback *)local_198,local_350,convexFromTrans,
                   convexToTrans,local_2b8,cVar33);
        local_198._0_8_ = &PTR__cbtTriangleCallback_00b6fec0;
        local_b8 = local_2b0;
        local_b0 = local_338;
        local_c8 = local_2b0->m_closestHitFraction;
        (*(pcVar15->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                  (pcVar15,local_2a8,local_2e8,&local_348);
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(local_30c * local_320)),ZEXT416((uint)local_318),
                                  ZEXT416((uint)local_2fc));
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_31c),ZEXT416((uint)local_304));
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_308 * local_320)),ZEXT416((uint)local_318),
                                  ZEXT416((uint)local_2f4));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)local_31c),ZEXT416((uint)local_2f8));
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(local_300 * local_320)),ZEXT416((uint)local_2ec),
                                  ZEXT416((uint)local_318));
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)local_2f0),ZEXT416((uint)local_31c));
        auVar30 = vinsertps_avx(ZEXT416((uint)(local_328 + auVar30._0_4_)),
                                ZEXT416((uint)(local_330 + auVar21._0_4_)),0x10);
        _local_360 = (cbtScalar  [4])
                     vmovlhps_avx(auVar30,ZEXT416((uint)(local_32c + auVar22._0_4_)));
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(local_30c * local_314)),ZEXT416((uint)local_310),
                                  ZEXT416((uint)local_2fc));
        auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_324),ZEXT416((uint)local_304));
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_308 * local_314)),ZEXT416((uint)local_310),
                                  ZEXT416((uint)local_2f4));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)local_324),ZEXT416((uint)local_2f8));
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(local_300 * local_314)),ZEXT416((uint)local_310),
                                  ZEXT416((uint)local_2ec));
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)local_324),ZEXT416((uint)local_2f0));
        fVar34 = local_328 + auVar30._0_4_;
        fVar5 = local_330 + auVar21._0_4_;
        local_370._0_4_ = local_360._0_4_;
        uVar12 = local_370._0_4_;
        stack0xfffffffffffffc94 = local_360._4_12_;
        auVar13 = stack0xfffffffffffffc94;
        cVar16.m_floats = _local_360;
        if (fVar34 < (float)local_370._0_4_) {
          local_370._0_4_ = fVar34;
          cVar16.m_floats = _local_370;
        }
        _local_370 = cVar16.m_floats;
        fVar11 = local_32c + auVar22._0_4_;
        if (fVar5 < (float)local_370._4_4_) {
          local_370._4_4_ = fVar5;
        }
        if (fVar11 < fStack_368) {
          fStack_368 = fVar11;
        }
        if (0.0 < fStack_364) {
          fStack_364 = 0.0;
        }
        cVar16.m_floats = _local_370;
        if ((float)uVar12 < fVar34) {
          local_370._4_4_ = auVar13._0_4_;
          fStack_368 = auVar13._4_4_;
          fStack_364 = auVar13._8_4_;
          local_360._4_4_ = local_370._4_4_;
          fStack_358 = fStack_368;
          fStack_354 = fStack_364;
          local_360._0_4_ = fVar34;
        }
        if ((float)local_360._4_4_ < fVar5) {
          local_360._4_4_ = fVar5;
        }
        if (fStack_358 < fVar11) {
          fStack_358 = fVar11;
        }
        if (fStack_354 < 0.0) {
          fStack_354 = 0.0;
        }
        cVar14.m_floats = _local_360;
        local_370._0_4_ = cVar16.m_floats[0];
        local_370._4_4_ = cVar16.m_floats[1];
        local_370._4_4_ = (float)local_2e8._4_4_ + (float)local_370._4_4_;
        local_370._0_4_ = (float)local_2e8._0_4_ + (float)local_370._0_4_;
        fStack_368 = cVar16.m_floats[2];
        fStack_364 = cVar16.m_floats[3];
        fStack_368 = (float)uStack_2e0 + fStack_368;
        local_360._4_4_ = local_348.m_floats[1] + (float)local_360._4_4_;
        local_360._0_4_ = local_348.m_floats[0] + (float)local_360._0_4_;
        fStack_358 = cVar14.m_floats[2];
        fStack_354 = cVar14.m_floats[3];
        fStack_358 = local_348.m_floats[2] + fStack_358;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                  (plane,local_198);
      }
      cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_198);
      return;
    }
    local_198._0_8_ = &PTR_DebugDraw_00b6ffb0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_dc[0] = 4.48416e-44;
    local_dc[1] = 0.0001;
    local_f0 = resultCallback->m_closestHitFraction;
    local_e8[2] = allowedPenetration;
    cbtContinuousConvexCollision::cbtContinuousConvexCollision
              ((cbtContinuousConvexCollision *)local_2a8,castShape,plane);
    cVar17 = (**(code **)((long)local_2a8 + 0x10))
                       (local_2a8,convexFromTrans,convexToTrans,this,this,local_198);
    if (cVar17 != '\0') {
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fStack_10c * fStack_10c)),ZEXT416((uint)local_110),
                                ZEXT416((uint)local_110));
      auVar30 = vfmadd213ss_fma(ZEXT416((uint)fStack_108),ZEXT416((uint)fStack_108),auVar30);
      fVar34 = auVar30._0_4_;
      if ((0.0001 < fVar34) && (local_f0 < resultCallback->m_closestHitFraction)) {
        if (fVar34 < 0.0) {
          fVar34 = sqrtf(fVar34);
        }
        else {
          auVar30 = vsqrtss_avx(auVar30,auVar30);
          fVar34 = auVar30._0_4_;
        }
        fVar34 = 1.0 / fVar34;
        local_110 = fVar34 * local_110;
        fStack_10c = fVar34 * fStack_10c;
        fStack_108 = fVar34 * fStack_108;
        local_268 = (undefined1  [8])colObjWrap->m_collisionObject;
        pcStack_260 = (cbtVoronoiSimplexSolver *)0x0;
        local_258 = (_func_int **)CONCAT44(fStack_10c,local_110);
        pcStack_250 = (cbtVoronoiSimplexSolver *)CONCAT44(cStack_104,fStack_108);
        local_248 = local_100[0];
        fStack_244 = local_100[1];
        acStack_240[0] = acStack_f8[0];
        acStack_240[1] = acStack_f8[1];
        local_238 = local_f0;
        (*resultCallback->_vptr_ConvexResultCallback[3])(resultCallback,local_268,1);
      }
    }
    this_01 = (cbtConvexCast *)local_2a8;
  }
  cbtConvexCast::~cbtConvexCast(this_01);
  return;
}

Assistant:

void cbtCollisionWorld::objectQuerySingleInternal(const cbtConvexShape* castShape, const cbtTransform& convexFromTrans, const cbtTransform& convexToTrans,
												 const cbtCollisionObjectWrapper* colObjWrap,
												 ConvexResultCallback& resultCallback, cbtScalar allowedPenetration)
{
	const cbtCollisionShape* collisionShape = colObjWrap->getCollisionShape();
	const cbtTransform& colObjWorldTransform = colObjWrap->getWorldTransform();

	if (collisionShape->isConvex())
	{
		//BT_PROFILE("convexSweepConvex");
		cbtConvexCast::CastResult castResult;
		castResult.m_allowedPenetration = allowedPenetration;
		castResult.m_fraction = resultCallback.m_closestHitFraction;  //cbtScalar(1.);//??

		cbtConvexShape* convexShape = (cbtConvexShape*)collisionShape;
		cbtVoronoiSimplexSolver simplexSolver;
		cbtGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;

		cbtContinuousConvexCollision convexCaster1(castShape, convexShape, &simplexSolver, &gjkEpaPenetrationSolver);
		//cbtGjkConvexCast convexCaster2(castShape,convexShape,&simplexSolver);
		//cbtSubsimplexConvexCast convexCaster3(castShape,convexShape,&simplexSolver);

		cbtConvexCast* castPtr = &convexCaster1;

		if (castPtr->calcTimeOfImpact(convexFromTrans, convexToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
		{
			//add hit
			if (castResult.m_normal.length2() > cbtScalar(0.0001))
			{
				if (castResult.m_fraction < resultCallback.m_closestHitFraction)
				{
					castResult.m_normal.normalize();
					cbtCollisionWorld::LocalConvexResult localConvexResult(
						colObjWrap->getCollisionObject(),
						0,
						castResult.m_normal,
						castResult.m_hitPoint,
						castResult.m_fraction);

					bool normalInWorldSpace = true;
					resultCallback.addSingleResult(localConvexResult, normalInWorldSpace);
				}
			}
		}
	}
	else
	{
		if (collisionShape->isConcave())
		{
			if (collisionShape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				//BT_PROFILE("convexSweepcbtBvhTriangleMesh");
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)collisionShape;
				cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
				cbtVector3 convexFromLocal = worldTocollisionObject * convexFromTrans.getOrigin();
				cbtVector3 convexToLocal = worldTocollisionObject * convexToTrans.getOrigin();
				// rotation of box in local mesh space = MeshRotation^-1 * ConvexToRotation
				cbtTransform rotationXform = cbtTransform(worldTocollisionObject.getBasis() * convexToTrans.getBasis());

				//ConvexCast::CastResult
				struct BridgeTriangleConvexcastCallback : public cbtTriangleConvexcastCallback
				{
					cbtCollisionWorld::ConvexResultCallback* m_resultCallback;
					const cbtCollisionObject* m_collisionObject;
					cbtTriangleMeshShape* m_triangleMesh;

					BridgeTriangleConvexcastCallback(const cbtConvexShape* castShape, const cbtTransform& from, const cbtTransform& to,
													 cbtCollisionWorld::ConvexResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtTriangleMeshShape* triangleMesh, const cbtTransform& triangleToWorld) : cbtTriangleConvexcastCallback(castShape, from, to, triangleToWorld, triangleMesh->getMargin()),
																																																								m_resultCallback(resultCallback),
																																																								m_collisionObject(collisionObject),
																																																								m_triangleMesh(triangleMesh)
					{
					}

					virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{
							cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																			 &shapeInfo,
																			 hitNormalLocal,
																			 hitPointLocal,
																			 hitFraction);

							bool normalInWorldSpace = true;

							return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
						}
						return hitFraction;
					}
				};

				BridgeTriangleConvexcastCallback tccb(castShape, convexFromTrans, convexToTrans, &resultCallback, colObjWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				tccb.m_hitFraction = resultCallback.m_closestHitFraction;
				tccb.m_allowedPenetration = allowedPenetration;
				cbtVector3 boxMinLocal, boxMaxLocal;
				castShape->getAabb(rotationXform, boxMinLocal, boxMaxLocal);
				triangleMesh->performConvexcast(&tccb, convexFromLocal, convexToLocal, boxMinLocal, boxMaxLocal);
			}
			else
			{
				if (collisionShape->getShapeType() == STATIC_PLANE_PROXYTYPE)
				{
					cbtConvexCast::CastResult castResult;
					castResult.m_allowedPenetration = allowedPenetration;
					castResult.m_fraction = resultCallback.m_closestHitFraction;
					cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)collisionShape;
					cbtContinuousConvexCollision convexCaster1(castShape, planeShape);
					cbtConvexCast* castPtr = &convexCaster1;

					if (castPtr->calcTimeOfImpact(convexFromTrans, convexToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
					{
						//add hit
						if (castResult.m_normal.length2() > cbtScalar(0.0001))
						{
							if (castResult.m_fraction < resultCallback.m_closestHitFraction)
							{
								castResult.m_normal.normalize();
								cbtCollisionWorld::LocalConvexResult localConvexResult(
									colObjWrap->getCollisionObject(),
									0,
									castResult.m_normal,
									castResult.m_hitPoint,
									castResult.m_fraction);

								bool normalInWorldSpace = true;
								resultCallback.addSingleResult(localConvexResult, normalInWorldSpace);
							}
						}
					}
				}
				else
				{
					//BT_PROFILE("convexSweepConcave");
					cbtConcaveShape* concaveShape = (cbtConcaveShape*)collisionShape;
					cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
					cbtVector3 convexFromLocal = worldTocollisionObject * convexFromTrans.getOrigin();
					cbtVector3 convexToLocal = worldTocollisionObject * convexToTrans.getOrigin();
					// rotation of box in local mesh space = MeshRotation^-1 * ConvexToRotation
					cbtTransform rotationXform = cbtTransform(worldTocollisionObject.getBasis() * convexToTrans.getBasis());

					//ConvexCast::CastResult
					struct BridgeTriangleConvexcastCallback : public cbtTriangleConvexcastCallback
					{
						cbtCollisionWorld::ConvexResultCallback* m_resultCallback;
						const cbtCollisionObject* m_collisionObject;
						cbtConcaveShape* m_triangleMesh;

						BridgeTriangleConvexcastCallback(const cbtConvexShape* castShape, const cbtTransform& from, const cbtTransform& to,
														 cbtCollisionWorld::ConvexResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtConcaveShape* triangleMesh, const cbtTransform& triangleToWorld) : cbtTriangleConvexcastCallback(castShape, from, to, triangleToWorld, triangleMesh->getMargin()),
																																																							   m_resultCallback(resultCallback),
																																																							   m_collisionObject(collisionObject),
																																																							   m_triangleMesh(triangleMesh)
						{
						}

						virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
						{
							cbtCollisionWorld::LocalShapeInfo shapeInfo;
							shapeInfo.m_shapePart = partId;
							shapeInfo.m_triangleIndex = triangleIndex;
							if (hitFraction <= m_resultCallback->m_closestHitFraction)
							{
								cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																				 &shapeInfo,
																				 hitNormalLocal,
																				 hitPointLocal,
																				 hitFraction);

								bool normalInWorldSpace = true;

								return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
							}
							return hitFraction;
						}
					};

					BridgeTriangleConvexcastCallback tccb(castShape, convexFromTrans, convexToTrans, &resultCallback, colObjWrap->getCollisionObject(), concaveShape, colObjWorldTransform);
					tccb.m_hitFraction = resultCallback.m_closestHitFraction;
					tccb.m_allowedPenetration = allowedPenetration;
					cbtVector3 boxMinLocal, boxMaxLocal;
					castShape->getAabb(rotationXform, boxMinLocal, boxMaxLocal);

					cbtVector3 rayAabbMinLocal = convexFromLocal;
					rayAabbMinLocal.setMin(convexToLocal);
					cbtVector3 rayAabbMaxLocal = convexFromLocal;
					rayAabbMaxLocal.setMax(convexToLocal);
					rayAabbMinLocal += boxMinLocal;
					rayAabbMaxLocal += boxMaxLocal;
					concaveShape->processAllTriangles(&tccb, rayAabbMinLocal, rayAabbMaxLocal);
				}
			}
		}
		else
		{
			if (collisionShape->isCompound())
			{
				struct cbtCompoundLeafCallback : cbtDbvt::ICollide
				{
					cbtCompoundLeafCallback(
						const cbtCollisionObjectWrapper* colObjWrap,
						const cbtConvexShape* castShape,
						const cbtTransform& convexFromTrans,
						const cbtTransform& convexToTrans,
						cbtScalar allowedPenetration,
						const cbtCompoundShape* compoundShape,
						const cbtTransform& colObjWorldTransform,
						ConvexResultCallback& resultCallback)
						: m_colObjWrap(colObjWrap),
						  m_castShape(castShape),
						  m_convexFromTrans(convexFromTrans),
						  m_convexToTrans(convexToTrans),
						  m_allowedPenetration(allowedPenetration),
						  m_compoundShape(compoundShape),
						  m_colObjWorldTransform(colObjWorldTransform),
						  m_resultCallback(resultCallback)
					{
					}

					const cbtCollisionObjectWrapper* m_colObjWrap;
					const cbtConvexShape* m_castShape;
					const cbtTransform& m_convexFromTrans;
					const cbtTransform& m_convexToTrans;
					cbtScalar m_allowedPenetration;
					const cbtCompoundShape* m_compoundShape;
					const cbtTransform& m_colObjWorldTransform;
					ConvexResultCallback& m_resultCallback;

				public:
					void ProcessChild(int index, const cbtTransform& childTrans, const cbtCollisionShape* childCollisionShape)
					{
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						struct LocalInfoAdder : public ConvexResultCallback
						{
							ConvexResultCallback* m_userCallback;
							int m_i;

							LocalInfoAdder(int i, ConvexResultCallback* user)
								: m_userCallback(user), m_i(i)
							{
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
							}
							virtual bool needsCollision(cbtBroadphaseProxy* p) const
							{
								return m_userCallback->needsCollision(p);
							}
							virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalConvexResult& r, bool b)
							{
								cbtCollisionWorld::LocalShapeInfo shapeInfo;
								shapeInfo.m_shapePart = -1;
								shapeInfo.m_triangleIndex = m_i;
								if (r.m_localShapeInfo == NULL)
									r.m_localShapeInfo = &shapeInfo;
								const cbtScalar result = m_userCallback->addSingleResult(r, b);
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
								return result;
							}
						};

						LocalInfoAdder my_cb(index, &m_resultCallback);

						cbtCollisionObjectWrapper tmpObj(m_colObjWrap, childCollisionShape, m_colObjWrap->getCollisionObject(), childWorldTrans, -1, index);

						objectQuerySingleInternal(m_castShape, m_convexFromTrans, m_convexToTrans, &tmpObj, my_cb, m_allowedPenetration);
					}

					void Process(const cbtDbvtNode* leaf)
					{
						// Processing leaf node
						int index = leaf->dataAsInt;

						cbtTransform childTrans = m_compoundShape->getChildTransform(index);
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(index);

						ProcessChild(index, childTrans, childCollisionShape);
					}
				};

				BT_PROFILE("convexSweepCompound");
				const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(collisionShape);

				cbtVector3 fromLocalAabbMin, fromLocalAabbMax;
				cbtVector3 toLocalAabbMin, toLocalAabbMax;

				castShape->getAabb(colObjWorldTransform.inverse() * convexFromTrans, fromLocalAabbMin, fromLocalAabbMax);
				castShape->getAabb(colObjWorldTransform.inverse() * convexToTrans, toLocalAabbMin, toLocalAabbMax);

				fromLocalAabbMin.setMin(toLocalAabbMin);
				fromLocalAabbMax.setMax(toLocalAabbMax);

				cbtCompoundLeafCallback callback(colObjWrap, castShape, convexFromTrans, convexToTrans,
												allowedPenetration, compoundShape, colObjWorldTransform, resultCallback);

				const cbtDbvt* tree = compoundShape->getDynamicAabbTree();
				if (tree)
				{
					const ATTRIBUTE_ALIGNED16(cbtDbvtVolume) bounds = cbtDbvtVolume::FromMM(fromLocalAabbMin, fromLocalAabbMax);
					tree->collideTV(tree->m_root, bounds, callback);
				}
				else
				{
					int i;
					for (i = 0; i < compoundShape->getNumChildShapes(); i++)
					{
						const cbtCollisionShape* childCollisionShape = compoundShape->getChildShape(i);
						cbtTransform childTrans = compoundShape->getChildTransform(i);
						callback.ProcessChild(i, childTrans, childCollisionShape);
					}
				}
			}
		}
	}
}